

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boundary_element.cpp
# Opt level: O0

void __thiscall BoundaryElement::run_GMRES(BoundaryElement *this)

{
  int iVar1;
  vector<double,_std::allocator<double>_> *this_00;
  double *x;
  BoundaryElement *this_01;
  ostream *poVar2;
  long in_RDI;
  int err_code;
  double *h;
  double *work;
  vector<double,_std::allocator<double>_> h_vec;
  vector<double,_std::allocator<double>_> work_vec;
  long num_iter;
  double residual;
  long ldh;
  long ldw;
  long length;
  long restrt;
  BoundaryElement *in_stack_fffffffffffffeb0;
  allocator_type *in_stack_fffffffffffffec0;
  Timer *this_02;
  size_type in_stack_fffffffffffffec8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffed0;
  double *work_00;
  double *b;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  long in_stack_ffffffffffffff70;
  double *in_stack_ffffffffffffff78;
  long in_stack_ffffffffffffff80;
  long *in_stack_ffffffffffffff88;
  double *in_stack_ffffffffffffff90;
  double local_61 [3];
  Timer local_48;
  size_type local_30;
  size_type local_28;
  long local_20;
  
  Timer::start((Timer *)in_stack_fffffffffffffeb0);
  local_20 = 10;
  this_00 = Output::potential(*(Output **)(in_RDI + 0x30));
  local_30 = std::vector<double,_std::allocator<double>_>::size(this_00);
  local_48.elapsed_time_.__r = (rep_conflict)(local_20 + 1);
  local_48.end_time_.__d.__r = (duration)0x3f1a36e2eb1c432d;
  local_48.start_time_.__d.__r = (duration)100;
  x = (double *)(local_30 * (local_20 + 4));
  b = local_61;
  local_28 = local_30;
  std::allocator<double>::allocator((allocator<double> *)0x124c72);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  std::allocator<double>::~allocator((allocator<double> *)0x124c9e);
  work_00 = (double *)&stack0xffffffffffffff6f;
  std::allocator<double>::allocator((allocator<double> *)0x124cd3);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  std::allocator<double>::~allocator((allocator<double> *)0x124cff);
  std::vector<double,_std::allocator<double>_>::data
            ((vector<double,_std::allocator<double>_> *)0x124d0c);
  this_01 = (BoundaryElement *)
            std::vector<double,_std::allocator<double>_>::data
                      ((vector<double,_std::allocator<double>_> *)0x124d21);
  copyin_clusters_to_device(in_stack_fffffffffffffeb0);
  Elements::source_term_ptr((Elements *)0x124d55);
  Output::potential(*(Output **)(in_RDI + 0x30));
  std::vector<double,_std::allocator<double>_>::data
            ((vector<double,_std::allocator<double>_> *)0x124d7e);
  this_02 = &local_48;
  iVar1 = gmres_(this_01,CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),b,x,in_RDI,
                 work_00,in_stack_ffffffffffffff70,in_stack_ffffffffffffff78,
                 in_stack_ffffffffffffff80,in_stack_ffffffffffffff88,in_stack_ffffffffffffff90);
  delete_clusters_from_device(this_01);
  Output::set_residual(*(Output **)(in_RDI + 0x30),(double)local_48.end_time_.__d.__r);
  Output::set_num_iter(*(Output **)(in_RDI + 0x30),(long)local_48.start_time_.__d.__r);
  if (iVar1 != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"GMRES error code ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    std::operator<<(poVar2,". Exiting.");
    exit(1);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"GMRES completed. ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(long)local_48.start_time_.__d.__r);
  poVar2 = std::operator<<(poVar2," iterations, ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(double)local_48.end_time_.__d.__r);
  std::operator<<(poVar2," residual.");
  Timer::stop(this_02);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)this_02);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)this_02);
  return;
}

Assistant:

void BoundaryElement::run_GMRES()
{
    timers_.run_GMRES.start();

    long int restrt = 10;
    long int length = output_.potential().size();
    long int ldw    = length;
    long int ldh    = restrt + 1;
    
    // These values are modified on return
    double residual   = 1e-4;
    long int num_iter = 100;

    std::vector<double> work_vec(ldw * (restrt + 4));
    std::vector<double> h_vec   (ldh * (restrt + 2));
    
    double* work = work_vec.data();
    double* h    = h_vec.data();

    BoundaryElement::copyin_clusters_to_device();
    
    int err_code = BoundaryElement::gmres_(length, elements_.source_term_ptr(), output_.potential().data(),
                                    restrt, work, ldw, h, ldh, num_iter, residual);

    BoundaryElement::delete_clusters_from_device();
    
    output_.set_residual(residual);
    output_.set_num_iter(num_iter);

    if (err_code) {
        std::cout << "GMRES error code " << err_code << ". Exiting.";
        std::exit(1);
    }
    
    std::cout << "GMRES completed. " << num_iter << " iterations, " << residual << " residual.";

    timers_.run_GMRES.stop();
}